

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O3

bool __thiscall re2::CharClass::Contains(CharClass *this,Rune r)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  
  lVar1 = *(long *)(this + 8);
  uVar3 = (ulong)*(uint *)(this + 0x10);
  do {
    while( true ) {
      iVar2 = (int)uVar3;
      if (iVar2 < 1) goto LAB_00138032;
      uVar3 = uVar3 >> 1;
      if (r <= *(int *)(lVar1 + 4 + uVar3 * 8)) break;
      lVar1 = lVar1 + uVar3 * 8 + 8;
      uVar3 = (ulong)(~(uint)uVar3 + iVar2);
    }
  } while (r < *(int *)(lVar1 + uVar3 * 8));
LAB_00138032:
  return 0 < iVar2;
}

Assistant:

bool CharClass::Contains(Rune r) {
  RuneRange* rr = ranges_;
  int n = nranges_;
  while (n > 0) {
    int m = n/2;
    if (rr[m].hi < r) {
      rr += m+1;
      n -= m+1;
    } else if (r < rr[m].lo) {
      n = m;
    } else {  // rr[m].lo <= r && r <= rr[m].hi
      return true;
    }
  }
  return false;
}